

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int mbedtls_rsa_pkcs1_encrypt
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,size_t ilen,uchar *input,uchar *output)

{
  uchar *input_local;
  size_t ilen_local;
  int mode_local;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_rsa_context *ctx_local;
  
  if (ctx->padding == 0) {
    ctx_local._4_4_ = mbedtls_rsa_rsaes_pkcs1_v15_encrypt(ctx,f_rng,p_rng,mode,ilen,input,output);
  }
  else if (ctx->padding == 1) {
    ctx_local._4_4_ =
         mbedtls_rsa_rsaes_oaep_encrypt(ctx,f_rng,p_rng,mode,(uchar *)0x0,0,ilen,input,output);
  }
  else {
    ctx_local._4_4_ = -0x4100;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_rsa_pkcs1_encrypt( mbedtls_rsa_context *ctx,
                       int (*f_rng)(void *, unsigned char *, size_t),
                       void *p_rng,
                       int mode, size_t ilen,
                       const unsigned char *input,
                       unsigned char *output )
{
    switch( ctx->padding )
    {
#if defined(MBEDTLS_PKCS1_V15)
        case MBEDTLS_RSA_PKCS_V15:
            return mbedtls_rsa_rsaes_pkcs1_v15_encrypt( ctx, f_rng, p_rng, mode, ilen,
                                                input, output );
#endif

#if defined(MBEDTLS_PKCS1_V21)
        case MBEDTLS_RSA_PKCS_V21:
            return mbedtls_rsa_rsaes_oaep_encrypt( ctx, f_rng, p_rng, mode, NULL, 0,
                                           ilen, input, output );
#endif

        default:
            return( MBEDTLS_ERR_RSA_INVALID_PADDING );
    }
}